

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

bool __thiscall Assembler::checkIfSection(Assembler *this,string *line)

{
  bool bVar1;
  string name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>_>
  local_c0;
  smatch sectionName;
  string local_68;
  string local_48;
  _List_base<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>
  local_28;
  
  sectionName.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sectionName._M_begin._M_current = (char *)0x0;
  sectionName.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sectionName.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,&sectionName,&sectionDirectiveReg_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&name,&sectionName,1);
    if (first == true) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<char,_std::allocator<char>_>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
                  *)&local_c0,&name,&this->bytes);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::vector<char,std::allocator<char>>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>>>
                  *)&this->codeBySection,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
                  *)&local_c0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
               *)&local_c0);
      local_28._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_28;
      local_28._M_impl._M_node._M_size = 0;
      local_28._M_impl._M_node.super__List_node_base._M_prev =
           local_28._M_impl._M_node.super__List_node_base._M_next;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>,_true>
                (&local_c0,&name,
                 (list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>
                  *)local_28._M_impl._M_node.super__List_node_base._M_next);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>>>>
      ::
      _M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>>>>
                  *)&this->relocationTable,&local_c0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>_>
      ::~pair(&local_c0);
      std::__cxx11::
      _List_base<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>
      ::_M_clear(&local_28);
      std::__cxx11::string::string((string *)&local_48,(string *)&name);
      processSectionFirstPass(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      isGlobalFirst = false;
    }
    else {
      std::__cxx11::string::string((string *)&local_68,(string *)&name);
      processSectionSecondPass(this,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    std::__cxx11::string::~string((string *)&name);
  }
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&sectionName);
  return bVar1;
}

Assistant:

bool Assembler::checkIfSection(string line) {
    smatch sectionName;
    if (regex_match(line, sectionName, sectionDirectiveReg)) {
        string name = sectionName.str(1);
        if (first) {
            codeBySection.insert(make_pair(name, bytes));
            relocationTable.insert(make_pair(name, list<relocationTableEntry>()));
            processSectionFirstPass(name);
            isGlobalFirst = false;
        } else processSectionSecondPass(name);
        return true;
    }
    return false;
}